

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tracer.cpp
# Opt level: O0

void __thiscall
helics::apps::Tracer::Tracer
          (Tracer *this,string_view appName,shared_ptr<helics::Core> *core,FederateInfo *fedInfo)

{
  shared_ptr<helics::Core> *in_RDI;
  unique_ptr<helics::CloningFilter,_std::default_delete<helics::CloningFilter>_>
  *in_stack_ffffffffffffff60;
  Tracer *this_00;
  FederateInfo *in_stack_ffffffffffffffa0;
  App *in_stack_ffffffffffffffb0;
  string_view in_stack_ffffffffffffffb8;
  
  App::App(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffb8,in_RDI,in_stack_ffffffffffffffa0);
  (in_RDI->super___shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
       (element_type *)&PTR__Tracer_009be570;
  *(undefined1 *)&in_RDI[10].super___shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>._M_ptr = 0
  ;
  *(undefined1 *)
   ((long)&in_RDI[10].super___shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 1) = 0;
  *(undefined1 *)
   ((long)&in_RDI[10].super___shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 2) = 0;
  std::unique_ptr<helics::CloningFilter,std::default_delete<helics::CloningFilter>>::
  unique_ptr<std::default_delete<helics::CloningFilter>,void>(in_stack_ffffffffffffff60);
  CLI::std::deque<helics::Input,_std::allocator<helics::Input>_>::deque
            ((deque<helics::Input,_std::allocator<helics::Input>_> *)0x240ad7);
  CLI::std::
  map<std::basic_string_view<char,_std::char_traits<char>_>,_int,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>
  ::map((map<std::basic_string_view<char,_std::char_traits<char>_>,_int,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>
         *)0x240aef);
  CLI::std::deque<helics::Endpoint,_std::allocator<helics::Endpoint>_>::deque
            ((deque<helics::Endpoint,_std::allocator<helics::Endpoint>_> *)0x240b05);
  this_00 = (Tracer *)(in_RDI + 0x18);
  CLI::std::
  map<std::basic_string_view<char,_std::char_traits<char>_>,_int,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>
  ::map((map<std::basic_string_view<char,_std::char_traits<char>_>,_int,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>
         *)0x240b1d);
  std::unique_ptr<helics::Endpoint,std::default_delete<helics::Endpoint>>::
  unique_ptr<std::default_delete<helics::Endpoint>,void>
            ((unique_ptr<helics::Endpoint,_std::default_delete<helics::Endpoint>_> *)this_00);
  CLI::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x240b49);
  CLI::std::
  function<void_(TimeRepresentation<count_time<9,_long>_>,_std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>)>
  ::function((function<void_(TimeRepresentation<count_time<9,_long>_>,_std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>)>
              *)this_00);
  CLI::std::
  function<void_(TimeRepresentation<count_time<9,_long>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>)>
  ::function((function<void_(TimeRepresentation<count_time<9,_long>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>)>
              *)this_00);
  CLI::std::
  function<void_(TimeRepresentation<count_time<9,_long>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>)>
  ::function((function<void_(TimeRepresentation<count_time<9,_long>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>)>
              *)this_00);
  initialSetup(this_00);
  return;
}

Assistant:

Tracer::Tracer(std::string_view appName,
               const std::shared_ptr<Core>& core,
               const FederateInfo& fedInfo): App(appName, core, fedInfo)
{
    initialSetup();
}